

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

void sq_newclosure(HSQUIRRELVM v,SQFUNCTION func,SQUnsignedInteger nfreevars)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  uint uVar3;
  SQObjectType SVar4;
  SQObjectPtr *pSVar5;
  long *plVar6;
  SQTable *pSVar7;
  SQObjectValue SVar8;
  SQObjectPtr *pSVar9;
  long lVar10;
  SQObjectPtr local_30;
  
  SVar8.pNativeClosure = SQNativeClosure::Create(v->_sharedstate,func,nfreevars);
  ((SVar8.pTable)->super_SQDelegable)._delegate = (SQTable *)0x0;
  if (nfreevars != 0) {
    lVar10 = 8;
    do {
      pSVar9 = SQVM::Top(v);
      pSVar5 = (SVar8.pClosure)->_outervalues;
      uVar3 = *(uint *)((long)pSVar5 + lVar10 + -8);
      plVar6 = *(long **)((long)&(pSVar5->super_SQObject)._type + lVar10);
      pSVar7 = (pSVar9->super_SQObject)._unVal.pTable;
      *(SQTable **)((long)&(pSVar5->super_SQObject)._type + lVar10) = pSVar7;
      SVar4 = (pSVar9->super_SQObject)._type;
      *(SQObjectType *)((long)pSVar5 + lVar10 + -8) = SVar4;
      if ((SVar4 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((uVar3 >> 0x1b & 1) != 0) {
        plVar2 = plVar6 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar6 + 0x10))();
        }
      }
      SQVM::Pop(v);
      lVar10 = lVar10 + 0x10;
      nfreevars = nfreevars - 1;
    } while (nfreevars != 0);
  }
  local_30.super_SQObject._type = OT_NATIVECLOSURE;
  pSVar1 = &((SVar8.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_30.super_SQObject._unVal.pNativeClosure = SVar8.pNativeClosure;
  SQVM::Push(v,&local_30);
  SQObjectPtr::~SQObjectPtr(&local_30);
  return;
}

Assistant:

void sq_newclosure(HSQUIRRELVM v,SQFUNCTION func,SQUnsignedInteger nfreevars)
{
    SQNativeClosure *nc = SQNativeClosure::Create(_ss(v), func,nfreevars);
    nc->_nparamscheck = 0;
    for(SQUnsignedInteger i = 0; i < nfreevars; i++) {
        nc->_outervalues[i] = v->Top();
        v->Pop();
    }
    v->Push(SQObjectPtr(nc));
}